

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IEnumerableCore.hpp
# Opt level: O1

IEnumerableCore<linq::SkipState<linq::WhereState<linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:49:44),_int>,_int>_>
* __thiscall
linq::
IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:49:44),_int>_>
::Skip(IEnumerableCore<linq::SkipState<linq::WhereState<linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:49:44),_int>,_int>_>
       *__return_storage_ptr__,
      IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:49:44),_int>_>
      *this,size_t count)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  
  peVar1 = (this->source).source.state.
           super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  this_00 = (this->source).source.state.
            super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    (__return_storage_ptr__->source).super_IState<int>._vptr_IState =
         (_func_int **)&PTR_Init_00157c70;
    (__return_storage_ptr__->source).source.super_IState<int>._vptr_IState =
         (_func_int **)&PTR_Init_00157be0;
    (__return_storage_ptr__->source).source.source.super_IState<int>._vptr_IState =
         (_func_int **)&PTR_Init_00157b88;
    (__return_storage_ptr__->source).source.source.state.
    super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar1;
    (__return_storage_ptr__->source).source.source.state.
    super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
    (__return_storage_ptr__->source).super_IState<int>._vptr_IState =
         (_func_int **)&PTR_Init_00157c70;
    (__return_storage_ptr__->source).source.super_IState<int>._vptr_IState =
         (_func_int **)&PTR_Init_00157be0;
    (__return_storage_ptr__->source).source.source.super_IState<int>._vptr_IState =
         (_func_int **)&PTR_Init_00157b88;
    (__return_storage_ptr__->source).source.source.state.
    super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar1;
    (__return_storage_ptr__->source).source.source.state.
    super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = this_00;
    if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      (__return_storage_ptr__->source).count = 3;
      return __return_storage_ptr__;
    }
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  (__return_storage_ptr__->source).count = 3;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  return __return_storage_ptr__;
}

Assistant:

auto Skip(size_t count) 
		{ 
			return IEnumerableCore<SkipState<S, T>>(
				SkipState<S, T>(std::move(source), count)
			);
		}